

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region_fwd.hpp
# Opt level: O2

void __thiscall toml::detail::region::region(region *this,region *param_1)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  
  std::
  __shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  *)this,(__shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                          *)param_1);
  std::__cxx11::string::string
            ((string *)&this->source_name_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &param_1->source_name_);
  this->last_column_ = param_1->last_column_;
  sVar1 = param_1->length_;
  sVar2 = param_1->first_;
  sVar3 = param_1->first_line_;
  sVar4 = param_1->first_column_;
  sVar5 = param_1->last_line_;
  this->last_ = param_1->last_;
  this->last_line_ = sVar5;
  this->first_line_ = sVar3;
  this->first_column_ = sVar4;
  this->length_ = sVar1;
  this->first_ = sVar2;
  return;
}

Assistant:

region(const region&) = default;